

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_div.c
# Opt level: O0

int BN_div(BIGNUM *dv,BIGNUM *rem,BIGNUM *m,BIGNUM *d,BN_CTX *ctx)

{
  int iVar1;
  int ret;
  BN_CTX *in_stack_000000a8;
  BIGNUM *in_stack_000000b0;
  BIGNUM *in_stack_000000b8;
  BIGNUM *in_stack_000000c0;
  BIGNUM *in_stack_000000c8;
  int local_4;
  
  iVar1 = BN_is_zero((BIGNUM *)d);
  if (iVar1 == 0) {
    if (d->d[d->top + -1] == 0) {
      ERR_new();
      ERR_set_debug((char *)m,(int)((ulong)d >> 0x20),(char *)ctx);
      ERR_set_error(3,0x6b,(char *)0x0);
      local_4 = 0;
    }
    else {
      local_4 = bn_div_fixed_top(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                                 in_stack_000000b0,in_stack_000000a8);
      if (local_4 != 0) {
        if (dv != (BIGNUM *)0x0) {
          bn_correct_top((BIGNUM *)dv);
        }
        if (rem != (BIGNUM *)0x0) {
          bn_correct_top((BIGNUM *)rem);
        }
      }
    }
  }
  else {
    ERR_new();
    ERR_set_debug((char *)m,(int)((ulong)d >> 0x20),(char *)ctx);
    ERR_set_error(3,0x67,(char *)0x0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BN_div(BIGNUM *dv, BIGNUM *rm, const BIGNUM *num, const BIGNUM *divisor,
           BN_CTX *ctx)
{
    int ret;

    if (BN_is_zero(divisor)) {
        ERR_raise(ERR_LIB_BN, BN_R_DIV_BY_ZERO);
        return 0;
    }

    /*
     * Invalid zero-padding would have particularly bad consequences so don't
     * just rely on bn_check_top() here (bn_check_top() works only for
     * BN_DEBUG builds)
     */
    if (divisor->d[divisor->top - 1] == 0) {
        ERR_raise(ERR_LIB_BN, BN_R_NOT_INITIALIZED);
        return 0;
    }

    ret = bn_div_fixed_top(dv, rm, num, divisor, ctx);

    if (ret) {
        if (dv != NULL)
            bn_correct_top(dv);
        if (rm != NULL)
            bn_correct_top(rm);
    }

    return ret;
}